

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  TestResult *this_00;
  TestInfo *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_e0 [24];
  undefined8 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff47;
  StreamingListener *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  TestInfo *local_10;
  
  local_10 = in_RSI;
  TestInfo::result(in_RSI);
  TestResult::Passed((TestResult *)0x18f998);
  __rhs = &local_b0;
  FormatBool_abi_cxx11_(in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
  std::operator+(&local_90,"event=TestEnd&passed=",__rhs);
  std::operator+(&local_70,&local_90,"&elapsed_time=");
  this_00 = TestInfo::result(local_10);
  TestResult::elapsed_time(this_00);
  StreamableToString<long_long>((longlong *)in_stack_ffffffffffffff38);
  std::operator+(&local_50,&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  std::operator+(&local_30,&local_50,"ms");
  SendLn((StreamingListener *)__rhs,in_RDI);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) {
    SendLn("event=TestEnd&passed=" +
           FormatBool((test_info.result())->Passed()) +
           "&elapsed_time=" +
           StreamableToString((test_info.result())->elapsed_time()) + "ms");
  }